

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommyhashlin.c
# Opt level: O1

void * tommy_hashlin_remove_existing(tommy_hashlin *hashlin,tommy_hashlin_node *node)

{
  long lVar1;
  tommy_hashlin_node **pptVar2;
  tommy_hashlin_node *ptVar3;
  tommy_hashlin_node *ptVar4;
  uint uVar5;
  uint uVar6;
  tommy_node_struct *ptVar7;
  tommy_hashlin_node *ptVar8;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar6 = hashlin->low_mask & node->key;
  if (uVar6 < hashlin->split) {
    uVar6 = node->key & hashlin->bucket_mask;
  }
  uVar5 = 0x1f;
  if ((uVar6 | 1) != 0) {
    for (; (uVar6 | 1) >> uVar5 == 0; uVar5 = uVar5 - 1) {
    }
  }
  pptVar2 = hashlin->bucket[uVar5];
  ptVar3 = pptVar2[uVar6];
  ptVar4 = node->next;
  ptVar8 = ptVar4;
  if (ptVar4 == (tommy_hashlin_node *)0x0) {
    ptVar8 = ptVar3;
  }
  ptVar8->prev = node->prev;
  if (ptVar3 == node) {
    ptVar7 = (tommy_node_struct *)(pptVar2 + uVar6);
  }
  else {
    ptVar7 = node->prev;
  }
  ptVar7->next = ptVar4;
  hashlin->count = hashlin->count - 1;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    hashlin_shrink_step(hashlin);
    return node->data;
  }
  __stack_chk_fail();
}

Assistant:

void* tommy_hashlin_remove_existing(tommy_hashlin* hashlin, tommy_hashlin_node* node)
{
	tommy_list_remove_existing(tommy_hashlin_bucket_ref(hashlin, node->key), node);

	--hashlin->count;

	hashlin_shrink_step(hashlin);

	return node->data;
}